

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::back_inserter_copy_if(void)

{
  int iVar1;
  ulong uVar2;
  basic_iterator<int> first_end;
  reference piVar3;
  ulong uVar4;
  pointer piVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  circular_view<int,_18446744073709551615UL> local_90;
  vector<int,_std::allocator<int>_> local_70;
  view_pointer local_58;
  size_type sStack_50;
  undefined8 local_44;
  undefined4 local_3c;
  type local_38 [6];
  
  local_90.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_90.member.cap = 4;
  local_90.member.size = 0;
  local_90.member.next = 4;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0xde0000006f;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x1bc0000014d;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x22b;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_44);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar5 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar1 = *piVar5;
      if (0xde < iVar1) {
        vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_90,1);
        piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_90);
        *piVar3 = iVar1;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_44 = 0x1bc0000014d;
  local_3c = 0x22b;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_44;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_00,&local_a9);
  uVar2 = local_90.member.cap * 2;
  if ((uVar2 & local_90.member.cap * 2 - 1) == 0) {
    uVar4 = local_90.member.next - local_90.member.size & uVar2 - 1;
    sStack_50 = uVar2 - 1 & local_90.member.next;
  }
  else {
    uVar4 = (local_90.member.next - local_90.member.size) % uVar2;
    sStack_50 = local_90.member.next % uVar2;
  }
  local_58 = &local_90;
  first_end.current = sStack_50;
  first_end.parent = local_58;
  first_begin.current = uVar4;
  first_begin.parent = local_58;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x6a,"void copy_suite::back_inserter_copy_if()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void back_inserter_copy_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 111, 222, 333, 444, 555 };
    std::copy_if(input.begin(), input.end(), std::back_inserter(span), [](int value) { return value > 222; });
    {
        std::vector<int> expect = { 333, 444, 555 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}